

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O2

void __thiscall CLI::App::run_callback(App *this,bool final_mode,bool suppress_final_callback)

{
  pointer psVar1;
  App *this_00;
  size_t sVar2;
  undefined7 in_register_00000031;
  shared_ptr<CLI::App> *subc;
  pointer psVar3;
  _Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_> local_48;
  
  (*this->_vptr_App[2])();
  if (((int)CONCAT71(in_register_00000031,final_mode) == 0) &&
     ((this->parse_complete_callback_).super__Function_base._M_manager != (_Manager_type)0x0)) {
    std::function<void_()>::operator()(&this->parse_complete_callback_);
  }
  std::vector<CLI::App_*,_std::allocator<CLI::App_*>_>::vector
            ((vector<CLI::App_*,_std::allocator<CLI::App_*>_> *)&local_48,&this->parsed_subcommands_
            );
  for (; local_48._M_impl.super__Vector_impl_data._M_start !=
         local_48._M_impl.super__Vector_impl_data._M_finish;
      local_48._M_impl.super__Vector_impl_data._M_start =
           local_48._M_impl.super__Vector_impl_data._M_start + 1) {
    if ((*local_48._M_impl.super__Vector_impl_data._M_start)->parent_ == this) {
      run_callback(*local_48._M_impl.super__Vector_impl_data._M_start,true,suppress_final_callback);
    }
  }
  std::_Vector_base<CLI::App_*,_std::allocator<CLI::App_*>_>::~_Vector_base(&local_48);
  psVar1 = (this->subcommands_).
           super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (psVar3 = (this->subcommands_).
                super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
                ._M_impl.super__Vector_impl_data._M_start; psVar3 != psVar1; psVar3 = psVar3 + 1) {
    this_00 = (psVar3->super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    if (((this_00->name_)._M_string_length == 0) && (sVar2 = count_all(this_00), sVar2 != 0)) {
      run_callback((psVar3->super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,true,
                   suppress_final_callback);
    }
  }
  if (((this->parsed_ != 0 &&
       (this->final_callback_).super__Function_base._M_manager != (_Manager_type)0x0) &&
       !suppress_final_callback) &&
     ((((this->name_)._M_string_length != 0 || (sVar2 = count_all(this), sVar2 != 0)) ||
      (this->parent_ == (App *)0x0)))) {
    std::function<void_()>::operator()(&this->final_callback_);
  }
  return;
}

Assistant:

CLI11_INLINE void App::run_callback(bool final_mode, bool suppress_final_callback) {
    pre_callback();
    // in the main app if immediate_callback_ is set it runs the main callback before the used subcommands
    if(!final_mode && parse_complete_callback_) {
        parse_complete_callback_();
    }
    // run the callbacks for the received subcommands
    for(App *subc : get_subcommands()) {
        if(subc->parent_ == this) {
            subc->run_callback(true, suppress_final_callback);
        }
    }
    // now run callbacks for option_groups
    for(auto &subc : subcommands_) {
        if(subc->name_.empty() && subc->count_all() > 0) {
            subc->run_callback(true, suppress_final_callback);
        }
    }

    // finally run the main callback
    if(final_callback_ && (parsed_ > 0) && (!suppress_final_callback)) {
        if(!name_.empty() || count_all() > 0 || parent_ == nullptr) {
            final_callback_();
        }
    }
}